

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

timediff_t cf_tcp_accept_timeleft(Curl_cfilter *cf,Curl_easy *data)

{
  void *pvVar1;
  long lVar2;
  timediff_t tVar3;
  curltime cVar4;
  curltime older;
  undefined1 local_40 [8];
  curltime now;
  timediff_t other;
  timediff_t timeout_ms;
  cf_socket_ctx *ctx;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  other = 60000;
  if ((data->set).accepttimeout != 0) {
    other = (timediff_t)(data->set).accepttimeout;
  }
  cVar4 = Curl_now();
  local_40 = (undefined1  [8])cVar4.tv_sec;
  now.tv_sec._0_4_ = cVar4.tv_usec;
  now._8_8_ = Curl_timeleft(data,(curltime *)local_40,false);
  if ((now._8_8_ == 0) || (lVar2 = now._8_8_, other <= (long)now._8_8_)) {
    cVar4.tv_usec = (int)now.tv_sec;
    cVar4.tv_sec = (time_t)local_40;
    cVar4._12_4_ = 0;
    older._12_4_ = 0;
    older._0_12_ = *(undefined1 (*) [12])((long)pvVar1 + 0x100);
    tVar3 = Curl_timediff(cVar4,older);
    lVar2 = other - tVar3;
    if (other - tVar3 == 0) {
      other = -1;
      lVar2 = other;
    }
  }
  other = lVar2;
  return other;
}

Assistant:

static timediff_t cf_tcp_accept_timeleft(struct Curl_cfilter *cf,
                                          struct Curl_easy *data)
{
  struct cf_socket_ctx *ctx = cf->ctx;
  timediff_t timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  timediff_t other;
  struct curltime now;

#ifndef CURL_DISABLE_FTP
  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;
#endif

  now = Curl_now();
  /* check if the generic timeout possibly is set shorter */
  other = Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_timediff(now, ctx->started_at);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      timeout_ms = -1;
  }
  return timeout_ms;
}